

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O2

string * __thiscall
cmFindProgramCommand::FindNormalProgramNamesPerDir_abi_cxx11_
          (string *__return_storage_ptr__,cmFindProgramCommand *this)

{
  pointer pbVar1;
  bool bVar2;
  string *n;
  pointer pbVar3;
  cmFindProgramHelper helper;
  allocator<char> local_b9;
  undefined1 local_b8 [56];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80 [3];
  
  cmFindProgramHelper::cmFindProgramHelper((cmFindProgramHelper *)local_b8);
  pbVar1 = (this->super_cmFindBase).Names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->super_cmFindBase).Names.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_80,pbVar3);
  }
  bVar2 = cmFindProgramHelper::CheckCompoundNames((cmFindProgramHelper *)local_b8);
  if (bVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_b8 + 0x18));
  }
  else {
    pbVar3 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pbVar1 = (this->super_cmFindBase).super_cmFindCommon.SearchPaths.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      if (pbVar3 == pbVar1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)__return_storage_ptr__,"",&local_b9);
        goto LAB_001e702a;
      }
      bVar2 = cmFindProgramHelper::CheckDirectory((cmFindProgramHelper *)local_b8,pbVar3);
      pbVar3 = pbVar3 + 1;
    } while (!bVar2);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_b8 + 0x18));
  }
LAB_001e702a:
  cmFindProgramHelper::~cmFindProgramHelper((cmFindProgramHelper *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmFindProgramCommand::FindNormalProgramNamesPerDir()
{
  // Search for all names in each directory.
  cmFindProgramHelper helper;
  for (std::string const& n : this->Names) {
    helper.AddName(n);
  }

  // Check for the names themselves if they contain a directory separator.
  if (helper.CheckCompoundNames()) {
    return helper.BestPath;
  }

  // Search every directory.
  for (std::string const& sp : this->SearchPaths) {
    if (helper.CheckDirectory(sp)) {
      return helper.BestPath;
    }
  }
  // Couldn't find the program.
  return "";
}